

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GenerateIntegerConstant
          (ConstantManager *this,Integer *integer_type,uint64_t result)

{
  uint number_of_bits;
  unsigned_long uVar1;
  Constant *pCVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  if (integer_type == (Integer *)0x0) {
    __assert_fail("integer_type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                  ,0x212,
                  "const Constant *spvtools::opt::analysis::ConstantManager::GenerateIntegerConstant(const analysis::Integer *, uint64_t)"
                 );
  }
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  number_of_bits = *(uint *)&(integer_type->super_Type).field_0x24;
  if ((ulong)number_of_bits == 0x40) {
    pvVar3 = &local_38;
    local_40 = (undefined1  [8])result;
  }
  else {
    if (0x20 < number_of_bits) {
      __assert_fail("integer_type->width() <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                    ,0x21b,
                    "const Constant *spvtools::opt::analysis::ConstantManager::GenerateIntegerConstant(const analysis::Integer *, uint64_t)"
                   );
    }
    if (integer_type->signed_ == true) {
      uVar1 = utils::SignExtendValue<unsigned_long>(result,number_of_bits);
      local_40._0_4_ = (undefined4)uVar1;
    }
    else {
      uVar1 = utils::ClearHighBits<unsigned_long>(result,0x40 - (ulong)number_of_bits);
      local_40._0_4_ = (undefined4)uVar1;
    }
    pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_40 + 4);
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,local_40,pvVar3);
  pCVar2 = GetConstant(this,&integer_type->super_Type,&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pCVar2;
}

Assistant:

const Constant* ConstantManager::GenerateIntegerConstant(
    const analysis::Integer* integer_type, uint64_t result) {
  assert(integer_type != nullptr);

  std::vector<uint32_t> words;
  if (integer_type->width() == 64) {
    // In the 64-bit case, two words are needed to represent the value.
    words = {static_cast<uint32_t>(result),
             static_cast<uint32_t>(result >> 32)};
  } else {
    // In all other cases, only a single word is needed.
    assert(integer_type->width() <= 32);
    if (integer_type->IsSigned()) {
      result = utils::SignExtendValue(result, integer_type->width());
    } else {
      result = utils::ZeroExtendValue(result, integer_type->width());
    }
    words = {static_cast<uint32_t>(result)};
  }
  return GetConstant(integer_type, words);
}